

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall
CCoinsViewCache::BatchWrite(CCoinsViewCache *this,CoinsViewCacheCursor *cursor,uint256 *hashBlockIn)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  CoinsCachePair *pCVar8;
  logic_error *this_00;
  size_t sVar9;
  pointer ppVar10;
  undefined4 *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  CCoinsCacheEntry *entry;
  CoinsCachePair *it;
  iterator itUs;
  CoinsCachePair *in_stack_ffffffffffffff38;
  CoinsCachePair *in_stack_ffffffffffffff40;
  CoinsViewCacheCursor *in_stack_ffffffffffffff48;
  CCoinsCacheEntry *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> in_stack_ffffffffffffff58
  ;
  CoinsCachePair *in_stack_ffffffffffffff60;
  CoinsViewCacheCursor *in_stack_ffffffffffffff68;
  CoinsCachePair *local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = CoinsViewCacheCursor::Begin((CoinsViewCacheCursor *)in_stack_ffffffffffffff38);
  do {
    pCVar8 = CoinsViewCacheCursor::End((CoinsViewCacheCursor *)in_stack_ffffffffffffff38);
    if (local_60 == pCVar8) {
      uVar2 = *in_RDX;
      uVar3 = in_RDX[1];
      uVar4 = in_RDX[2];
      uVar5 = in_RDX[3];
      uVar6 = *(undefined8 *)(in_RDX + 6);
      *(undefined8 *)(in_RDI + 0x21) = *(undefined8 *)(in_RDX + 4);
      *(undefined8 *)(in_RDI + 0x29) = uVar6;
      *(undefined4 *)(in_RDI + 0x11) = uVar2;
      *(undefined4 *)(in_RDI + 0x15) = uVar3;
      *(undefined4 *)(in_RDI + 0x19) = uVar4;
      *(undefined4 *)(in_RDI + 0x1d) = uVar5;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return true;
      }
LAB_018f873a:
      __stack_chk_fail();
    }
    bVar7 = CCoinsCacheEntry::IsDirty((CCoinsCacheEntry *)in_stack_ffffffffffffff38);
    if (bVar7) {
      std::
      unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
      ::find((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
              *)in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->first);
      std::
      unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
      ::end((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
             *)in_stack_ffffffffffffff40);
      bVar7 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> *
                         )in_stack_ffffffffffffff48,
                         (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> *
                         )in_stack_ffffffffffffff40);
      if (bVar7) {
        bVar7 = CCoinsCacheEntry::IsFresh((CCoinsCacheEntry *)in_stack_ffffffffffffff38);
        if ((!bVar7) || (bVar7 = Coin::IsSpent((Coin *)in_stack_ffffffffffffff38), !bVar7)) {
          std::
          unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
          ::try_emplace<>((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                           *)in_stack_ffffffffffffff58._M_cur,(key_type *)in_stack_ffffffffffffff50)
          ;
          ppVar10 = std::__detail::
                    _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                                *)in_stack_ffffffffffffff38);
          pCVar8 = (CoinsCachePair *)&ppVar10->second;
          bVar7 = CoinsViewCacheCursor::WillErase
                            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
          if (bVar7) {
            Coin::operator=((Coin *)in_stack_ffffffffffffff48,(Coin *)in_stack_ffffffffffffff40);
          }
          else {
            Coin::operator=((Coin *)in_stack_ffffffffffffff48,(Coin *)in_stack_ffffffffffffff40);
          }
          sVar9 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff38);
          *(size_t *)(in_RDI + 0x1c0) = sVar9 + *(long *)(in_RDI + 0x1c0);
          in_stack_ffffffffffffff68 = (CoinsViewCacheCursor *)pCVar8;
          std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
          ::operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                      in_stack_ffffffffffffff38);
          CCoinsCacheEntry::AddFlags
                    (in_stack_ffffffffffffff50,(uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38),
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          bVar7 = CCoinsCacheEntry::IsFresh((CCoinsCacheEntry *)in_stack_ffffffffffffff38);
          if (bVar7) {
            std::__detail::
            _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator*
                      ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
            CCoinsCacheEntry::AddFlags
                      (in_stack_ffffffffffffff50,(uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38)
                       ,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            in_stack_ffffffffffffff60 = pCVar8;
          }
        }
      }
      else {
        bVar7 = CCoinsCacheEntry::IsFresh((CCoinsCacheEntry *)in_stack_ffffffffffffff38);
        if (bVar7) {
          std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
          bVar7 = Coin::IsSpent((Coin *)in_stack_ffffffffffffff38);
          if (!bVar7) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      (this_00,"FRESH flag misapplied to coin that exists in parent cache");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            goto LAB_018f873a;
          }
        }
        std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
        operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                   in_stack_ffffffffffffff38);
        bVar7 = CCoinsCacheEntry::IsFresh((CCoinsCacheEntry *)in_stack_ffffffffffffff38);
        if ((bVar7) && (bVar7 = Coin::IsSpent((Coin *)in_stack_ffffffffffffff38), bVar7)) {
          std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
          sVar9 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff38);
          *(size_t *)(in_RDI + 0x1c0) = *(long *)(in_RDI + 0x1c0) - sVar9;
          std::
          unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
          ::erase((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                   *)in_stack_ffffffffffffff40,(iterator)in_stack_ffffffffffffff58._M_cur);
        }
        else {
          std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
          sVar9 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff38);
          *(size_t *)(in_RDI + 0x1c0) = *(long *)(in_RDI + 0x1c0) - sVar9;
          bVar7 = CoinsViewCacheCursor::WillErase
                            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
          if (bVar7) {
            in_stack_ffffffffffffff50 = (CCoinsCacheEntry *)&(local_60->second).coin;
            std::__detail::
            _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator->
                      ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
            Coin::operator=((Coin *)in_stack_ffffffffffffff48,(Coin *)in_stack_ffffffffffffff40);
          }
          else {
            in_stack_ffffffffffffff48 = (CoinsViewCacheCursor *)&(local_60->second).coin;
            std::__detail::
            _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator->
                      ((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
            Coin::operator=((Coin *)in_stack_ffffffffffffff48,(Coin *)in_stack_ffffffffffffff40);
          }
          std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                       )in_stack_ffffffffffffff38);
          sVar9 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff38);
          *(size_t *)(in_RDI + 0x1c0) = sVar9 + *(long *)(in_RDI + 0x1c0);
          ppVar10 = std::__detail::
                    _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                                *)in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff40 = (CoinsCachePair *)&ppVar10->second;
          std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
          ::operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
                      in_stack_ffffffffffffff38);
          CCoinsCacheEntry::AddFlags
                    (in_stack_ffffffffffffff50,(uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38),
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
      }
    }
    local_60 = CoinsViewCacheCursor::NextAndMaybeErase
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  } while( true );
}

Assistant:

bool CCoinsViewCache::BatchWrite(CoinsViewCacheCursor& cursor, const uint256 &hashBlockIn) {
    for (auto it{cursor.Begin()}; it != cursor.End(); it = cursor.NextAndMaybeErase(*it)) {
        // Ignore non-dirty entries (optimization).
        if (!it->second.IsDirty()) {
            continue;
        }
        CCoinsMap::iterator itUs = cacheCoins.find(it->first);
        if (itUs == cacheCoins.end()) {
            // The parent cache does not have an entry, while the child cache does.
            // We can ignore it if it's both spent and FRESH in the child
            if (!(it->second.IsFresh() && it->second.coin.IsSpent())) {
                // Create the coin in the parent cache, move the data up
                // and mark it as dirty.
                itUs = cacheCoins.try_emplace(it->first).first;
                CCoinsCacheEntry& entry{itUs->second};
                if (cursor.WillErase(*it)) {
                    // Since this entry will be erased,
                    // we can move the coin into us instead of copying it
                    entry.coin = std::move(it->second.coin);
                } else {
                    entry.coin = it->second.coin;
                }
                cachedCoinsUsage += entry.coin.DynamicMemoryUsage();
                entry.AddFlags(CCoinsCacheEntry::DIRTY, *itUs, m_sentinel);
                // We can mark it FRESH in the parent if it was FRESH in the child
                // Otherwise it might have just been flushed from the parent's cache
                // and already exist in the grandparent
                if (it->second.IsFresh()) {
                    entry.AddFlags(CCoinsCacheEntry::FRESH, *itUs, m_sentinel);
                }
            }
        } else {
            // Found the entry in the parent cache
            if (it->second.IsFresh() && !itUs->second.coin.IsSpent()) {
                // The coin was marked FRESH in the child cache, but the coin
                // exists in the parent cache. If this ever happens, it means
                // the FRESH flag was misapplied and there is a logic error in
                // the calling code.
                throw std::logic_error("FRESH flag misapplied to coin that exists in parent cache");
            }

            if (itUs->second.IsFresh() && it->second.coin.IsSpent()) {
                // The grandparent cache does not have an entry, and the coin
                // has been spent. We can just delete it from the parent cache.
                cachedCoinsUsage -= itUs->second.coin.DynamicMemoryUsage();
                cacheCoins.erase(itUs);
            } else {
                // A normal modification.
                cachedCoinsUsage -= itUs->second.coin.DynamicMemoryUsage();
                if (cursor.WillErase(*it)) {
                    // Since this entry will be erased,
                    // we can move the coin into us instead of copying it
                    itUs->second.coin = std::move(it->second.coin);
                } else {
                    itUs->second.coin = it->second.coin;
                }
                cachedCoinsUsage += itUs->second.coin.DynamicMemoryUsage();
                itUs->second.AddFlags(CCoinsCacheEntry::DIRTY, *itUs, m_sentinel);
                // NOTE: It isn't safe to mark the coin as FRESH in the parent
                // cache. If it already existed and was spent in the parent
                // cache then marking it FRESH would prevent that spentness
                // from being flushed to the grandparent.
            }
        }
    }
    hashBlock = hashBlockIn;
    return true;
}